

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

string * __thiscall
tcu::FloatFormat::floatToHex_abi_cxx11_(string *__return_storage_ptr__,FloatFormat *this,double x)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  double __x;
  ulong in_XMM0_Qb;
  int exp;
  double local_1c8;
  double local_1b8;
  ulong uStack_1b0;
  ostringstream oss;
  
  if (NAN(x)) {
    pcVar5 = "NaN";
  }
  else {
    local_1c8 = x;
    if (x < -1.79769313486232e+308 == x <= 1.79769313486232e+308) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&oss,"inf",(allocator<char> *)&exp);
      pcVar5 = "+";
      if (local_1c8 < 0.0) {
        pcVar5 = "-";
      }
      std::operator+(__return_storage_ptr__,pcVar5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      return __return_storage_ptr__;
    }
    if ((x != 0.0) || (NAN(x))) {
      exp = 0;
      local_1b8 = -x;
      uStack_1b0 = in_XMM0_Qb ^ 0x8000000000000000;
      __x = deFractExp((double)(~-(ulong)(local_1b8 <= x) & (ulong)local_1b8 |
                               -(ulong)(local_1b8 <= x) & (ulong)x),&exp);
      iVar3 = this->m_minExp - exp;
      iVar6 = 0;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      iVar6 = this->m_fractionBits - iVar6;
      ldexp(__x,iVar6);
      iVar3 = this->m_fractionBits;
      iVar7 = exp + iVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      pcVar5 = "";
      if (local_1c8 < local_1b8) {
        pcVar5 = "-";
      }
      poVar4 = std::operator<<((ostream *)&oss,pcVar5);
      poVar4 = std::operator<<(poVar4,"0x");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,".");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(long *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = (long)((iVar3 + 3) / 4);
      poVar4 = std::operator<<(poVar4,0x30);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"p");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 2;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0;
      std::ostream::operator<<(poVar4,iVar7 - iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      return __return_storage_ptr__;
    }
    pcVar5 = "0.0";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar5,(allocator<char> *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string	FloatFormat::floatToHex	(double x) const
{
	if (deIsNaN(x))
		return "NaN";
	else if (deIsInf(x))
		return (x < 0.0 ? "-" : "+") + std::string("inf");
	else if (x == 0.0) // \todo [2014-03-27 lauri] Negative zero
		return "0.0";

	int					exp			= 0;
	const double		frac		= deFractExp(deAbs(x), &exp);
	const int			shift		= exponentShift(exp);
	const deUint64		bits		= deUint64(deLdExp(frac, shift));
	const deUint64		whole		= bits >> m_fractionBits;
	const deUint64		fraction	= bits & ((deUint64(1) << m_fractionBits) - 1);
	const int			exponent	= exp + m_fractionBits - shift;
	const int			numDigits	= (m_fractionBits + 3) / 4;
	const deUint64		aligned		= fraction << (numDigits * 4 - m_fractionBits);
	std::ostringstream	oss;

	oss << (x < 0 ? "-" : "")
		<< "0x" << whole << "."
		<< std::hex << std::setw(numDigits) << std::setfill('0') << aligned
		<< "p" << std::dec << std::setw(0) << exponent;

	return oss.str();
}